

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTTGame.cpp
# Opt level: O0

TTTGame * __thiscall TTTGame::GetName_abi_cxx11_(TTTGame *this)

{
  long in_RSI;
  TTTGame *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)(in_RSI + 0x60));
  return this;
}

Assistant:

string TTTGame::GetName() const {
    return m_name;
}